

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfc_tiles.cpp
# Opt level: O3

int sfc_tiles(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_color _Var2;
  undefined1 auVar3 [16];
  pointer pTVar4;
  void *pvVar5;
  pointer pTVar6;
  undefined8 uVar7;
  pointer poVar8;
  char **argv_00;
  bool bVar9;
  Mode MVar10;
  int iVar11;
  uint uVar12;
  runtime_error *prVar13;
  undefined1 uVar14;
  uint32_t colors_per_subpalette;
  undefined4 uVar15;
  ulong uVar16;
  Mode extraout_EDX;
  Mode extraout_EDX_00;
  Mode extraout_EDX_01;
  Mode MVar17;
  ulong uVar18;
  _Base_ptr p_Var19;
  undefined7 uVar20;
  _Base_ptr p_Var21;
  _Base_ptr p_Var22;
  _Base_ptr p_Var23;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar24;
  Image *img;
  pointer image_00;
  pointer poVar25;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  string_view fmt_11;
  format_args args_10;
  bool verbose;
  string mode_str;
  bool help;
  Image image;
  vector<sfc::Image,_std::allocator<sfc::Image>_> crops;
  bool local_a29;
  undefined1 local_a28 [32];
  vector<sfc::Tile,_std::allocator<sfc::Tile>_> local_a08;
  undefined1 local_9e8 [16];
  undefined1 auStack_9d8 [24];
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  undefined8 local_908;
  undefined2 local_900;
  uint local_8fc;
  uint uStack_8f8;
  bool local_8f4 [4];
  uint local_8f0 [2];
  undefined1 local_8e8 [16];
  vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> local_8d8;
  rgba_t local_8c0;
  bool local_8bc;
  undefined1 local_8b8 [32];
  undefined1 local_898 [32];
  undefined1 local_878 [16];
  pointer local_868;
  _Base_ptr local_860;
  _Base_ptr local_858;
  _Base_ptr local_850;
  pointer local_848;
  pointer poStack_840;
  pointer local_838;
  _Base_ptr p_Stack_830;
  _Rb_tree<int,_std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>,_std::_Select1st<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
  local_828;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_7f8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_7c8;
  int local_798;
  _Alloc_hider local_790;
  size_type local_788;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_780;
  vector<sfc::Image,_std::allocator<sfc::Image>_> local_770;
  char **local_758;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
  local_9a8._M_string_length = 0;
  local_9a8.field_2._M_local_buf[0] = '\0';
  local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
  local_988._M_string_length = 0;
  local_988.field_2._M_local_buf[0] = '\0';
  local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
  local_968._M_string_length = 0;
  local_968.field_2._M_local_buf[0] = '\0';
  local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
  local_948._M_string_length = 0;
  local_948.field_2._M_local_buf[0] = '\0';
  local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
  local_928._M_string_length = 0;
  local_928.field_2._M_local_buf[0] = '\0';
  local_8f0[0] = 0;
  local_8f0[1] = 0;
  local_908 = 0;
  local_900 = 0;
  local_8f4[0] = false;
  local_8f4[1] = false;
  local_8fc = 0;
  uStack_8f8 = 0;
  local_a29 = false;
  local_8e8._0_8_ = local_8e8._0_8_ & 0xffffffffffffff00;
  local_a28._0_8_ = local_a28 + 0x10;
  local_a28._8_4_ = 0;
  local_a28._12_4_ = 0;
  local_a28._16_4_ = local_a28._16_4_ & 0xffffff00;
  local_898._0_8_ = local_898 + 0x10;
  local_898._8_4_ = 0;
  local_898._12_4_ = 0;
  local_898._16_4_ = local_898._16_4_ & 0xffffff00;
  local_858 = (_Base_ptr)&local_868;
  local_868 = (pointer)((ulong)local_868 & 0xffffffff00000000);
  local_860 = (_Base_ptr)0x0;
  local_828._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_828._M_impl.super__Rb_tree_header._M_header;
  local_828._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_828._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_848 = (pointer)0x0;
  poStack_840 = (pointer)0x0;
  local_838 = (pointer)0x0;
  p_Stack_830 = (_Base_ptr)0x0;
  local_828._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_7f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_7f8._M_impl.super__Rb_tree_header._M_header;
  local_7f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_7f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_7f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_7c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_7c8._M_impl.super__Rb_tree_header._M_header;
  local_7c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_7c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_7c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_798 = 0x100;
  local_790._M_p = (pointer)&local_780;
  local_788 = 0;
  local_780._M_local_buf[0] = '\0';
  local_878._0_8_ = (pointer)0x1c00000002;
  local_850 = local_858;
  local_828._M_impl.super__Rb_tree_header._M_header._M_right =
       local_828._M_impl.super__Rb_tree_header._M_header._M_left;
  local_7f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_7f8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_7c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_7c8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_898,0,0,
             "Usage: superfamiconv tiles [<options>]\n",0x27);
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"in-image","");
  local_758 = argv;
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"Input: image","");
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_898,&local_9a8,'i',&local_310,&local_330,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"in-data","");
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"Input: native data","");
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_898,&local_988,'n',&local_350,&local_370,&local_90,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"in-palette","");
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3b0,"Input: palette (native/json)","");
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_898,&local_968,'p',&local_390,&local_3b0,&local_d0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"out-data","");
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"Output: native data","");
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_898,&local_948,'d',&local_3d0,&local_3f0,&local_110,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"out-image","");
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"Output: image","");
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_898,&local_928,'o',&local_410,&local_430,&local_150,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,
                    CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                             local_150.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"mode","");
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"Mode <default: snes>","");
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"snes","");
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Settings","");
  Options::Add<std::__cxx11::string>
            ((Options *)local_898,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a28,'M',
             &local_450,&local_470,&local_490,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"bpp","");
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"Bits per pixel","");
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Settings","");
  Options::Add<unsigned_int>
            ((Options *)local_898,(uint *)((long)&local_908 + 4),'B',&local_4b0,&local_4d0,4,
             &local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"tile-width","");
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"Tile width","");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Settings","");
  Options::Add<unsigned_int>((Options *)local_898,&local_8fc,'W',&local_4f0,&local_510,8,&local_1d0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"tile-height","");
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"Tile height","");
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"Settings","");
  Options::Add<unsigned_int>
            ((Options *)local_898,&uStack_8f8,'H',&local_530,&local_550,8,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"no-remap","");
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"Don\'t remap colors","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Settings","");
  Options::AddSwitch((Options *)local_898,local_8f4,'R',&local_570,&local_590,false,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"no-discard","");
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5d0,"Don\'t discard redundant tiles","");
  paVar1 = &local_230.field_2;
  local_230._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"Settings","");
  Options::AddSwitch((Options *)local_898,(bool *)&local_900,'D',&local_5b0,&local_5d0,false,
                     &local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"no-flip","");
  local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_610,"Don\'t discard using tile flipping","");
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Settings","");
  Options::AddSwitch((Options *)local_898,(bool *)((long)&local_900 + 1),'F',&local_5f0,&local_610,
                     false,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
  }
  local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"sprite-mode","");
  local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_650,"Apply sprite output settings","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Settings","");
  Options::AddSwitch((Options *)local_898,local_8f4 + 1,'S',&local_630,&local_650,false,&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_dataplus._M_p != &local_630.field_2) {
    operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
  }
  local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"max-tiles","");
  local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"Maximum number of tiles","")
  ;
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Settings","");
  Options::Add<unsigned_int>((Options *)local_898,local_8f0,'T',&local_670,&local_690,0,&local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"out-image-width","");
  local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"Width of out-image","");
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Settings","");
  Options::Add<unsigned_int>
            ((Options *)local_898,local_8f0 + 1,'\0',&local_6b0,&local_6d0,0,&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
    operator_delete(local_6d0._M_dataplus._M_p,local_6d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
    operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
  }
  local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f0,"verbose","");
  local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_710,"Verbose logging","");
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"_","");
  Options::AddSwitch((Options *)local_898,&local_a29,'v',&local_6f0,&local_710,false,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710._M_dataplus._M_p != &local_710.field_2) {
    operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
    operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
  }
  local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"help","");
  local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"Show this help","");
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"_","");
  aVar24.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)0x0;
  Options::AddSwitch((Options *)local_898,(bool *)local_8e8,'h',&local_730,&local_750,false,
                     &local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  argv_00 = local_758;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
  }
  bVar9 = Options::Parse((Options *)local_898,argc,argv_00);
  if (bVar9) {
    if ((argc < 3) || (local_8e8[0] == true)) {
      Options::Usage_abi_cxx11_((string *)local_9e8,(Options *)local_898);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_9e8._0_8_,
                 CONCAT44(local_9e8._12_4_,local_9e8._8_4_));
      if ((vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> *)local_9e8._0_8_ !=
          (vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> *)auStack_9d8) {
        operator_delete((void *)local_9e8._0_8_,
                        CONCAT17(auStack_9d8[7],
                                 CONCAT16(auStack_9d8[6],
                                          CONCAT24(auStack_9d8._4_2_,auStack_9d8._0_4_))) + 1);
      }
      bVar9 = false;
      iVar11 = 0;
    }
    else {
      MVar10 = sfc::mode((string *)local_a28);
      MVar17 = pce_sprite;
      if (local_8f4[1] == false) {
        MVar17 = MVar10;
      }
      if (MVar10 != pce) {
        MVar17 = MVar10;
      }
      local_908 = CONCAT44(local_908._4_4_,MVar17);
      if (MVar17 == pce_sprite) {
        local_8f4[1] = true;
      }
      local_9e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)auStack_9d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9e8,"bpp","");
      p_Var23 = local_7c8._M_impl.super__Rb_tree_header._M_header._M_parent;
      poVar8 = local_838;
      uVar7 = local_9e8._0_8_;
      poVar25 = poStack_840;
      if (poStack_840 != local_838) {
LAB_00131612:
        iVar11 = strcmp(poVar25->name,(char *)uVar7);
        if (iVar11 != 0) goto code_r0x00131626;
        aVar24.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
             &local_7c8._M_impl.super__Rb_tree_header;
        if (p_Var23 != (_Base_ptr)0x0) {
          iVar11 = poVar25->val;
          p_Var22 = (_Base_ptr)aVar24;
          do {
            p_Var19 = p_Var23;
            p_Var21 = p_Var22;
            _Var2 = p_Var19[1]._M_color;
            p_Var22 = p_Var19;
            if ((int)_Var2 < iVar11) {
              p_Var22 = p_Var21;
            }
            p_Var23 = (&p_Var19->_M_left)[(int)_Var2 < iVar11];
          } while ((&p_Var19->_M_left)[(int)_Var2 < iVar11] != (_Base_ptr)0x0);
          p_Var23 = (_Base_ptr)aVar24;
          if (p_Var22 != (_Base_ptr)aVar24.values_) {
            if ((int)_Var2 < iVar11) {
              p_Var19 = p_Var21;
            }
            p_Var23 = p_Var22;
            if (iVar11 < (int)p_Var19[1]._M_color) {
              p_Var23 = (_Base_ptr)aVar24;
            }
          }
          bVar9 = p_Var23 != (_Base_ptr)aVar24.values_;
          uVar20 = (undefined7)((ulong)paVar1 >> 8);
          goto LAB_00131b23;
        }
      }
LAB_00131b21:
      bVar9 = false;
      uVar20 = 0;
LAB_00131b23:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar7 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_9d8) {
        operator_delete((void *)uVar7,
                        CONCAT17(auStack_9d8[7],
                                 CONCAT16(auStack_9d8[6],
                                          CONCAT24(auStack_9d8._4_2_,auStack_9d8._0_4_))) + 1);
      }
      if (!bVar9) {
        uVar15 = 4;
        if ((local_908 & 0xffffffff) < 0x11) {
          uVar15 = *(undefined4 *)(&DAT_0015fb94 + (local_908 & 0xffffffff) * 4);
        }
        local_908 = CONCAT44(uVar15,(Mode)local_908);
      }
      local_9e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)auStack_9d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9e8,"tile-width","");
      p_Var23 = local_7c8._M_impl.super__Rb_tree_header._M_header._M_parent;
      poVar8 = local_838;
      uVar7 = local_9e8._0_8_;
      poVar25 = poStack_840;
      if (poStack_840 != local_838) {
LAB_00131b9d:
        iVar11 = strcmp(poVar25->name,(char *)uVar7);
        if (iVar11 != 0) goto code_r0x00131bad;
        if (p_Var23 != (_Base_ptr)0x0) {
          iVar11 = poVar25->val;
          aVar24.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
               &local_7c8._M_impl.super__Rb_tree_header;
          p_Var22 = (_Base_ptr)aVar24;
          do {
            p_Var19 = p_Var23;
            p_Var21 = p_Var22;
            _Var2 = p_Var19[1]._M_color;
            p_Var22 = p_Var19;
            if ((int)_Var2 < iVar11) {
              p_Var22 = p_Var21;
            }
            p_Var23 = (&p_Var19->_M_left)[(int)_Var2 < iVar11];
          } while ((&p_Var19->_M_left)[(int)_Var2 < iVar11] != (_Base_ptr)0x0);
          p_Var23 = (_Base_ptr)aVar24;
          if (p_Var22 != (_Base_ptr)aVar24.values_) {
            if ((int)_Var2 < iVar11) {
              p_Var19 = p_Var21;
            }
            p_Var23 = p_Var22;
            if (iVar11 < (int)p_Var19[1]._M_color) {
              p_Var23 = (_Base_ptr)aVar24;
            }
          }
          bVar9 = p_Var23 != (_Base_ptr)aVar24.values_;
          goto LAB_00131c14;
        }
      }
LAB_00131c12:
      bVar9 = false;
      uVar20 = 0;
LAB_00131c14:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar7 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_9d8) {
        operator_delete((void *)uVar7,
                        CONCAT17(auStack_9d8[7],
                                 CONCAT16(auStack_9d8[6],
                                          CONCAT24(auStack_9d8._4_2_,auStack_9d8._0_4_))) + 1);
      }
      if (!bVar9) {
        local_8fc = (uint)((Mode)local_908 == 9) * 8 + 8;
      }
      local_9e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)auStack_9d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9e8,"tile-height","");
      p_Var23 = local_7c8._M_impl.super__Rb_tree_header._M_header._M_parent;
      poVar8 = local_838;
      uVar7 = local_9e8._0_8_;
      poVar25 = poStack_840;
      if (poStack_840 != local_838) {
LAB_00131c86:
        iVar11 = strcmp(poVar25->name,(char *)uVar7);
        if (iVar11 != 0) goto code_r0x00131c96;
        if (p_Var23 != (_Base_ptr)0x0) {
          iVar11 = poVar25->val;
          aVar24.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
               &local_7c8._M_impl.super__Rb_tree_header;
          p_Var22 = (_Base_ptr)aVar24;
          do {
            p_Var19 = p_Var23;
            p_Var21 = p_Var22;
            _Var2 = p_Var19[1]._M_color;
            p_Var22 = p_Var19;
            if ((int)_Var2 < iVar11) {
              p_Var22 = p_Var21;
            }
            p_Var23 = (&p_Var19->_M_left)[(int)_Var2 < iVar11];
          } while ((&p_Var19->_M_left)[(int)_Var2 < iVar11] != (_Base_ptr)0x0);
          p_Var23 = (_Base_ptr)aVar24;
          if (p_Var22 != (_Base_ptr)aVar24.values_) {
            if ((int)_Var2 < iVar11) {
              p_Var19 = p_Var21;
            }
            p_Var23 = p_Var22;
            if (iVar11 < (int)p_Var19[1]._M_color) {
              p_Var23 = (_Base_ptr)aVar24;
            }
          }
          bVar9 = p_Var23 != (_Base_ptr)aVar24.values_;
          goto LAB_00131cfd;
        }
      }
LAB_00131cfb:
      bVar9 = false;
      uVar20 = 0;
LAB_00131cfd:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar7 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_9d8) {
        operator_delete((void *)uVar7,
                        CONCAT17(auStack_9d8[7],
                                 CONCAT16(auStack_9d8[6],
                                          CONCAT24(auStack_9d8._4_2_,auStack_9d8._0_4_))) + 1);
      }
      if (!bVar9) {
        uStack_8f8 = (uint)((Mode)local_908 == 9) * 8 + 8;
      }
      local_9e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)auStack_9d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9e8,"no-flip","");
      p_Var23 = local_7c8._M_impl.super__Rb_tree_header._M_header._M_parent;
      poVar8 = local_838;
      uVar7 = local_9e8._0_8_;
      poVar25 = poStack_840;
      if (poStack_840 != local_838) {
LAB_00131d6f:
        iVar11 = strcmp(poVar25->name,(char *)uVar7);
        if (iVar11 != 0) goto code_r0x00131d7f;
        if (p_Var23 != (_Base_ptr)0x0) {
          iVar11 = poVar25->val;
          aVar24.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
               &local_7c8._M_impl.super__Rb_tree_header;
          p_Var22 = (_Base_ptr)aVar24;
          do {
            p_Var19 = p_Var23;
            p_Var21 = p_Var22;
            _Var2 = p_Var19[1]._M_color;
            p_Var22 = p_Var19;
            if ((int)_Var2 < iVar11) {
              p_Var22 = p_Var21;
            }
            p_Var23 = (&p_Var19->_M_left)[(int)_Var2 < iVar11];
          } while ((&p_Var19->_M_left)[(int)_Var2 < iVar11] != (_Base_ptr)0x0);
          p_Var23 = (_Base_ptr)aVar24;
          if (p_Var22 != (_Base_ptr)aVar24.values_) {
            if ((int)_Var2 < iVar11) {
              p_Var19 = p_Var21;
            }
            p_Var23 = p_Var22;
            if (iVar11 < (int)p_Var19[1]._M_color) {
              p_Var23 = (_Base_ptr)aVar24;
            }
          }
          bVar9 = p_Var23 != (_Base_ptr)aVar24.values_;
          goto LAB_00131de6;
        }
      }
LAB_00131de4:
      bVar9 = false;
      uVar20 = 0;
LAB_00131de6:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar7 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_9d8) {
        operator_delete((void *)uVar7,
                        CONCAT17(auStack_9d8[7],
                                 CONCAT16(auStack_9d8[6],
                                          CONCAT24(auStack_9d8._4_2_,auStack_9d8._0_4_))) + 1);
      }
      if (!bVar9) {
        uVar14 = 1;
        if ((Mode)local_908 - 1 < 0xe) {
          uVar14 = (&DAT_0015fbd8)[(Mode)local_908 - 1];
        }
        local_900 = CONCAT11(uVar14,local_900._0_1_);
      }
      local_9e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)auStack_9d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9e8,"max-tiles","");
      p_Var23 = local_7c8._M_impl.super__Rb_tree_header._M_header._M_parent;
      poVar8 = local_838;
      uVar7 = local_9e8._0_8_;
      poVar25 = poStack_840;
      if (poStack_840 != local_838) {
LAB_00131e60:
        iVar11 = strcmp(poVar25->name,(char *)uVar7);
        if (iVar11 != 0) goto code_r0x00131e70;
        if (p_Var23 != (_Base_ptr)0x0) {
          iVar11 = poVar25->val;
          aVar24.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
               &local_7c8._M_impl.super__Rb_tree_header;
          p_Var22 = (_Base_ptr)aVar24;
          do {
            p_Var19 = p_Var23;
            p_Var21 = p_Var22;
            _Var2 = p_Var19[1]._M_color;
            p_Var22 = p_Var19;
            if ((int)_Var2 < iVar11) {
              p_Var22 = p_Var21;
            }
            p_Var23 = (&p_Var19->_M_left)[(int)_Var2 < iVar11];
          } while ((&p_Var19->_M_left)[(int)_Var2 < iVar11] != (_Base_ptr)0x0);
          p_Var23 = (_Base_ptr)aVar24;
          if (p_Var22 != (_Base_ptr)aVar24.values_) {
            if ((int)_Var2 < iVar11) {
              p_Var19 = p_Var21;
            }
            p_Var23 = p_Var22;
            if (iVar11 < (int)p_Var19[1]._M_color) {
              p_Var23 = (_Base_ptr)aVar24;
            }
          }
          iVar11 = (int)CONCAT71(uVar20,p_Var23 != (_Base_ptr)aVar24.values_);
          goto LAB_00131ed7;
        }
      }
LAB_00131ed5:
      iVar11 = 0;
LAB_00131ed7:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar7 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_9d8) {
        operator_delete((void *)uVar7,
                        CONCAT17(auStack_9d8[7],
                                 CONCAT16(auStack_9d8[6],
                                          CONCAT24(auStack_9d8._4_2_,auStack_9d8._0_4_))) + 1);
      }
      if ((char)iVar11 == '\0') {
        uVar12 = sfc::max_tile_count_for_mode((Mode)local_908);
        local_8f0[0] = uVar12;
      }
      if (0x10 < (Mode)local_908) {
LAB_00131f2a:
        local_8fc = (uint)((Mode)local_908 == 9) * 8 + 8;
        if (local_a29 == true) {
          local_9e8._0_8_ = ZEXT48(local_8fc);
          args_08.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_9e8;
          args_08.desc_ = 2;
          fmt_10.size_ = 0x3e;
          fmt_10.data_ = "Tile width not allowed for specified mode, using default ({})\n";
          ::fmt::v10::vprint(fmt_10,args_08);
        }
LAB_00131f6e:
        uVar12 = 8;
        if ((Mode)local_908 < 0x11) {
          if ((0x1fde4U >> ((Mode)local_908 & 0x1f) & 1) == 0) {
            if ((0x1aU >> ((Mode)local_908 & 0x1f) & 1) != 0) goto LAB_00131fa3;
            if ((Mode)local_908 == 9) goto LAB_00131fdd;
          }
          else {
            if (uStack_8f8 == 8) goto LAB_00132015;
            if ((Mode)local_908 == 9) goto LAB_00131fe2;
          }
        }
        goto LAB_00131fe7;
      }
      if ((0x1fdfcU >> ((Mode)local_908 & 0x1f) & 1) != 0) {
        if (local_8fc != 8) goto LAB_00131f2a;
        goto LAB_00131f6e;
      }
      if ((Mode)local_908 == 1) {
        if ((local_8fc != 0x10) && (local_8fc != 8)) goto LAB_00131f2a;
LAB_00131fa3:
        if ((uStack_8f8 != 8) && (uVar12 = 8, uStack_8f8 != 0x10)) goto LAB_00131fe7;
      }
      else {
        if (((Mode)local_908 != 9) || (local_8fc != 0x10)) goto LAB_00131f2a;
LAB_00131fdd:
        if (uStack_8f8 != 0x10) {
LAB_00131fe2:
          uVar12 = 0x10;
LAB_00131fe7:
          uStack_8f8 = uVar12;
          if (local_a29 == true) {
            local_9e8._0_8_ = ZEXT48(uVar12);
            args_09.field_1.values_ =
                 (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_9e8;
            args_09.desc_ = 2;
            fmt_11.size_ = 0x3f;
            fmt_11.data_ = "Tile height not allowed for specified mode, using default ({})\n";
            ::fmt::v10::vprint(fmt_11,args_09);
          }
        }
      }
LAB_00132015:
      if (local_8f4[1] == true) {
        local_900 = 0x101;
      }
      bVar9 = sfc::bpp_allowed_for_mode(local_908._4_4_,(Mode)local_908);
      if (!bVar9) {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar13,"bpp setting not allowed for specified mode");
        __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar9 = true;
    }
  }
  else {
    iVar11 = 1;
    bVar9 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_p != &local_780) {
    operator_delete(local_790._M_p,
                    CONCAT71(local_780._M_allocated_capacity._1_7_,local_780._M_local_buf[0]) + 1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_7c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_7f8);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>,_std::_Select1st<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
  ::~_Rb_tree(&local_828);
  if (poStack_840 != (pointer)0x0) {
    operator_delete(poStack_840,(long)p_Stack_830 - (long)poStack_840);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_878 + 8));
  MVar17 = extraout_EDX;
  if ((undefined1 *)local_898._0_8_ != local_898 + 0x10) {
    operator_delete((void *)local_898._0_8_,CONCAT44(local_898._20_4_,local_898._16_4_) + 1);
    MVar17 = extraout_EDX_00;
  }
  if ((undefined1 *)local_a28._0_8_ != local_a28 + 0x10) {
    operator_delete((void *)local_a28._0_8_,
                    CONCAT17(local_a28[0x17],
                             CONCAT16(local_a28[0x16],CONCAT24(local_a28._20_2_,local_a28._16_4_)))
                    + 1);
    MVar17 = extraout_EDX_01;
  }
  if (bVar9) {
    if (local_9a8._M_string_length == 0 && local_988._M_string_length == 0) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar13,"Input image or native data required");
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_a29 == true) {
      sfc::mode_abi_cxx11_((string *)local_898,(sfc *)(local_908 & 0xffffffff),MVar17);
      local_a28._0_8_ = local_898._0_8_;
      local_a28._8_4_ = local_898._8_4_;
      local_a28._12_4_ = local_898._12_4_;
      args.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_a28;
      args.desc_ = 0xd;
      fmt_00.size_ = 0x28;
      fmt_00.data_ = "Performing tiles operation in \"{}\" mode\n";
      ::fmt::v10::vprint(fmt_00,args);
      if ((undefined1 *)local_898._0_8_ != local_898 + 0x10) {
        operator_delete((void *)local_898._0_8_,CONCAT44(local_898._20_4_,local_898._16_4_) + 1);
      }
    }
    local_a28._0_8_ = (pointer)0x100000000;
    local_a28._8_4_ = 4;
    local_a28._12_4_ = 8;
    local_a28._16_4_ = 8;
    local_a28._20_2_ = 0;
    local_a28[0x16] = '\0';
    local_a28._24_4_ = 0;
    local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_988._M_string_length == 0) {
      sfc::Image::Image((Image *)local_898,&local_9a8);
      sfc::Image::crops(&local_770,(Image *)local_898,local_8fc,uStack_8f8,(Mode)local_908);
      if (local_a29 == true) {
        sfc::Image::description_abi_cxx11_((string *)local_8e8,(Image *)local_898);
        auStack_9d8._12_4_ = local_8e8._12_4_;
        local_9e8._0_8_ = local_9a8._M_dataplus._M_p;
        local_9e8._8_4_ = (undefined4)local_9a8._M_string_length;
        local_9e8._12_4_ = (undefined4)(local_9a8._M_string_length >> 0x20);
        auStack_9d8._0_4_ = (undefined4)local_8e8._0_8_;
        auStack_9d8._4_2_ = SUB82(local_8e8._0_8_,4);
        auStack_9d8[6] = SUB81(local_8e8._0_8_,6);
        auStack_9d8[7] = SUB81(local_8e8._0_8_,7);
        args_01.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_9e8;
        args_01.desc_ = 0xdd;
        fmt_02.size_ = 0x1c;
        fmt_02.data_ = "Loaded image from \"{}\" ({})\n";
        ::fmt::v10::vprint(fmt_02,args_01);
        if ((vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> *)local_8e8._0_8_ !=
            &local_8d8) {
          operator_delete((void *)local_8e8._0_8_,
                          (ulong)((long)local_8d8.
                                        super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1));
        }
      }
      if ((((Mode)local_908 == 8) && (local_8f4[1] == true)) &&
         (((local_898._0_8_ & 0xf) != 0 || ((local_898._0_8_ & 0xf00000000) != 0)))) {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar13,"pce/sprite-mode requires image dimensions to be a multiple of 16");
        __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (local_a29 == true) {
        local_9e8._0_8_ =
             ((long)local_770.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_770.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f;
        auStack_9d8._16_8_ = ZEXT48(uStack_8f8);
        auStack_9d8._0_4_ = local_8fc;
        auStack_9d8._4_2_ = 0;
        auStack_9d8[6] = '\0';
        auStack_9d8[7] = '\0';
        args_02.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_9e8;
        args_02.desc_ = 0x224;
        fmt_03.size_ = 0x23;
        fmt_03.data_ = "Image sliced into {} {}x{}px tiles\n";
        ::fmt::v10::vprint(fmt_03,args_02);
      }
      local_8b8._16_8_ =
           local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_8b8._8_8_ =
           local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_8b8._0_8_ =
           local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_8e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1;
      local_8e8._8_4_ = 0;
      local_8d8.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_8d8.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
      super__Vector_impl_data._M_finish._0_5_ = 0;
      local_8d8.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
      super__Vector_impl_data._M_finish._5_3_ = 0;
      local_8d8.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
      local_8d8.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      local_8c0 = 0;
      local_8bc = false;
      local_9e8._0_8_ = (ulong)(Mode)local_908 << 0x20;
      local_9e8._8_4_ = local_908._4_4_;
      local_9e8._12_4_ = local_8fc;
      auStack_9d8._0_4_ = uStack_8f8;
      auStack_9d8._4_2_ = local_900;
      auStack_9d8[6] = local_8f4[0];
      auStack_9d8._8_4_ = local_8f0[0];
      local_a28._16_4_ = uStack_8f8;
      local_a28._20_2_ = local_900;
      local_a28[0x16] = local_8f4[0];
      local_a28[0x17] = auStack_9d8[7];
      local_a28._24_4_ = local_8f0[0];
      local_a28._0_8_ = (ulong)(Mode)local_908 << 0x20;
      local_a28._8_4_ = local_908._4_4_;
      local_a28._12_4_ = local_8fc;
      local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_9d8._16_8_ = (pointer)0x0;
      uStack_9c0._0_4_ = 0;
      uStack_9c0._4_1_ = false;
      uStack_9c0._5_3_ = 0;
      local_9b8 = 0;
      std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::~vector
                ((vector<sfc::Tile,_std::allocator<sfc::Tile>_> *)local_8b8);
      std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::~vector
                ((vector<sfc::Tile,_std::allocator<sfc::Tile>_> *)(auStack_9d8 + 0x10));
      if (local_8f4[0] == true) {
        if ((int)((ulong)((long)local_850 - (long)local_858) >> 2) == 0) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar13,"\"--no-remap\" requires indexed color image");
          goto LAB_001321d7;
        }
        if (local_a29 == true) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_9e8;
          fmt_04.size_ = 0x2f;
          fmt_04.data_ = "Creating tile data straight from color indices\n";
          ::fmt::v10::vprint(fmt_04,(format_args)(auVar3 << 0x40));
        }
      }
      else {
        if (local_968._M_string_length == 0) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar13,"Input palette required (except in --no-remap mode)");
LAB_001321d7:
          __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        colors_per_subpalette = 1;
        for (iVar11 = local_908._4_4_; iVar11 != 0; iVar11 = iVar11 + -1) {
          colors_per_subpalette = colors_per_subpalette * 2;
        }
        sfc::Palette::Palette((Palette *)local_9e8,&local_968,(Mode)local_908,colors_per_subpalette)
        ;
        local_8e8._8_4_ = local_9e8._8_4_;
        local_8e8._0_8_ = local_9e8._0_8_;
        local_8b8._16_8_ =
             CONCAT35(local_8d8.
                      super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._5_3_,
                      local_8d8.
                      super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._0_5_);
        pTVar4 = (pointer)CONCAT17(auStack_9d8[7],
                                   CONCAT16(auStack_9d8[6],
                                            CONCAT24(auStack_9d8._4_2_,auStack_9d8._0_4_)));
        local_8d8.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_5_ = (undefined5)auStack_9d8._16_8_;
        local_8d8.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_3_ = SUB83(auStack_9d8._16_8_,5);
        local_8b8._8_8_ =
             CONCAT35(local_8d8.
                      super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                      super__Vector_impl_data._M_finish._5_3_,
                      local_8d8.
                      super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_5_);
        local_8d8.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
        super__Vector_impl_data._M_finish._0_5_ = (undefined5)auStack_9d8._8_8_;
        local_8d8.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
        super__Vector_impl_data._M_finish._5_3_ = SUB83(auStack_9d8._8_8_,5);
        local_8b8._0_8_ =
             local_8d8.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl
             .super__Vector_impl_data._M_start;
        auStack_9d8._0_4_ = 0;
        auStack_9d8._4_2_ = 0;
        auStack_9d8[6] = '\0';
        auStack_9d8[7] = '\0';
        auStack_9d8._8_8_ = 0;
        auStack_9d8._16_8_ = (pointer)0x0;
        local_8d8.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pTVar4;
        std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::~vector
                  ((vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> *)local_8b8);
        local_8c0 = (rgba_t)uStack_9c0;
        local_8bc = uStack_9c0._4_1_;
        std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::~vector
                  ((vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> *)auStack_9d8);
        uVar12 = sfc::Palette::size((Palette *)local_8e8);
        if (uVar12 == 0) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar13,"Input palette size is zero");
          goto LAB_001321d7;
        }
        if (local_a29 == true) {
          sfc::Palette::description_abi_cxx11_((string *)local_8b8,(Palette *)local_8e8);
          local_9e8._0_8_ = local_968._M_dataplus._M_p;
          local_9e8._8_4_ = (undefined4)local_968._M_string_length;
          local_9e8._12_4_ = (undefined4)(local_968._M_string_length >> 0x20);
          auStack_9d8._0_4_ = (undefined4)local_8b8._0_8_;
          auStack_9d8._4_2_ = SUB82(local_8b8._0_8_,4);
          auStack_9d8[6] = SUB81(local_8b8._0_8_,6);
          auStack_9d8[7] = SUB81(local_8b8._0_8_,7);
          auStack_9d8._8_8_ = local_8b8._8_8_;
          args_03.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_9e8;
          args_03.desc_ = 0xdd;
          fmt_05.size_ = 0x2b;
          fmt_05.data_ = "Remapping tile data from palette \"{}\" ({})\n";
          ::fmt::v10::vprint(fmt_05,args_03);
          if ((pointer)local_8b8._0_8_ != (pointer)(local_8b8 + 0x10)) {
            operator_delete((void *)local_8b8._0_8_,(ulong)(local_8b8._16_8_ + 1));
          }
        }
      }
      if (local_770.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_770.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        image_00 = local_770.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
                   super__Vector_impl_data._M_start;
        do {
          sfc::Tileset::add((Tileset *)local_a28,image_00,(Palette *)local_8e8);
          image_00 = image_00 + 1;
        } while (image_00 !=
                 local_770.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      uVar16 = (ulong)(uint)local_a28._24_4_;
      if ((uVar16 != 0) &&
         (uVar18 = ((long)local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3,
         uVar16 <= uVar18 && uVar18 - uVar16 != 0)) {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_9e8._0_8_ =
             ZEXT48((uint)((int)((ulong)((long)local_a08.
                                               super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_a08.
                                              super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x45d1745d));
        auStack_9d8._0_4_ = local_a28._24_4_;
        auStack_9d8._4_2_ = 0;
        auStack_9d8[6] = '\0';
        auStack_9d8[7] = '\0';
        fmt.size_ = 0x22;
        fmt.data_ = (char *)0x3f;
        args_10.field_1.args_ = aVar24.args_;
        args_10.desc_ = (unsigned_long_long)local_9e8;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_8b8,
                   (v10 *)"Tileset exceeds maximum size ({} entries generated, {} maximum)",fmt,
                   args_10);
        std::runtime_error::runtime_error(prVar13,(string *)local_8b8);
        __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (local_a29 == true) {
        uVar16 = ((long)local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
        if (local_900._0_1_ == true) {
          local_9e8._0_8_ = uVar16 & 0xffffffff;
          args_04.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_9e8;
          args_04.desc_ = 2;
          fmt_06.size_ = 0x20;
          fmt_06.data_ = "Created tileset with {} entries\n";
          ::fmt::v10::vprint(fmt_06,args_04);
        }
        else {
          local_9e8._0_8_ = uVar16 & 0xffffffff;
          auStack_9d8._0_4_ = (undefined4)local_a28._0_8_;
          auStack_9d8._4_2_ = 0;
          auStack_9d8[6] = '\0';
          auStack_9d8[7] = '\0';
          args_05.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_9e8;
          args_05.desc_ = 0x22;
          fmt_07.size_ = 0x49;
          fmt_07.data_ = 
          "Created optimized tileset with {} entries (discarded {} redundant tiles)\n";
          ::fmt::v10::vprint(fmt_07,args_05);
        }
      }
      std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::~vector(&local_8d8);
      std::vector<sfc::Image,_std::allocator<sfc::Image>_>::~vector(&local_770);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&poStack_840);
      if (local_858 != (_Base_ptr)0x0) {
        operator_delete(local_858,(long)local_848 - (long)local_858);
      }
      if ((pointer)local_878._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_878._8_8_,(long)local_860 - local_878._8_8_);
      }
      pvVar5 = (void *)CONCAT44(local_898._20_4_,local_898._16_4_);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,local_878._0_8_ - (long)pvVar5);
      }
    }
    else {
      sfc::read_binary((byte_vec_t *)local_8e8,&local_988);
      sfc::Tileset::Tileset
                ((Tileset *)local_898,(byte_vec_t *)local_8e8,(Mode)local_908,local_908._4_4_,
                 local_8fc,uStack_8f8,local_900._1_1_);
      pTVar6 = local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pTVar4 = local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_9e8._0_8_ =
           local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_a28._16_4_ = local_898._16_4_;
      local_a28._20_2_ = (undefined2)local_898._20_4_;
      local_a28[0x16] = SUB41(local_898._20_4_,2);
      local_a28[0x17] = SUB41(local_898._20_4_,3);
      local_a28._24_4_ = local_898._24_4_;
      local_a28._0_8_ = local_898._0_8_;
      local_a28._8_4_ = local_898._8_4_;
      local_a28._12_4_ = local_898._12_4_;
      local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_868;
      local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_878._0_8_;
      local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_878._8_8_;
      local_9e8._8_4_ = SUB84(pTVar4,0);
      local_9e8._12_4_ = (undefined4)((ulong)pTVar4 >> 0x20);
      auStack_9d8._0_4_ = SUB84(pTVar6,0);
      auStack_9d8._4_2_ = (undefined2)((ulong)pTVar6 >> 0x20);
      auStack_9d8[6] = (undefined1)((ulong)pTVar6 >> 0x30);
      auStack_9d8[7] = (undefined1)((ulong)pTVar6 >> 0x38);
      local_878._0_8_ = (pointer)0x0;
      local_878._8_8_ = (pointer)0x0;
      local_868 = (pointer)0x0;
      std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::~vector
                ((vector<sfc::Tile,_std::allocator<sfc::Tile>_> *)local_9e8);
      std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::~vector
                ((vector<sfc::Tile,_std::allocator<sfc::Tile>_> *)local_878);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8e8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_8e8._0_8_,
                        (long)local_8d8.
                              super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
                              _M_impl.super__Vector_impl_data._M_start - local_8e8._0_8_);
      }
      if (local_a29 == true) {
        local_898._16_4_ =
             (int)((ulong)((long)local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_a08.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x45d1745d;
        local_898._0_8_ = local_988._M_dataplus._M_p;
        local_898._8_4_ = (undefined4)local_988._M_string_length;
        local_898._12_4_ = (undefined4)(local_988._M_string_length >> 0x20);
        local_898._20_4_ = 0;
        args_00.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_898;
        args_00.desc_ = 0x2d;
        fmt_01.size_ = 0x22;
        fmt_01.data_ = "Loaded tiles from \"{}\" ({} tiles)\n";
        ::fmt::v10::vprint(fmt_01,args_00);
      }
    }
    if ((local_948._M_string_length != 0) &&
       (sfc::Tileset::save((Tileset *)local_a28,&local_948), local_a29 == true)) {
      local_898._0_8_ = local_948._M_dataplus._M_p;
      local_898._8_4_ = (undefined4)local_948._M_string_length;
      local_898._12_4_ = (undefined4)(local_948._M_string_length >> 0x20);
      args_06.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_898;
      args_06.desc_ = 0xd;
      fmt_08.size_ = 0x1f;
      fmt_08.data_ = "Saved native tile data to \"{}\"\n";
      ::fmt::v10::vprint(fmt_08,args_06);
    }
    if (local_928._M_string_length != 0) {
      sfc::Image::Image((Image *)local_898,(Tileset *)local_a28,local_8f0[1]);
      if (local_988._M_string_length == 0) {
        sfc::Image::save((Image *)local_898,&local_928);
      }
      else {
        sfc::Image::save_indexed((Image *)local_898,&local_928);
      }
      if (local_a29 == true) {
        local_9e8._0_8_ = local_928._M_dataplus._M_p;
        local_9e8._8_4_ = (undefined4)local_928._M_string_length;
        local_9e8._12_4_ = (undefined4)(local_928._M_string_length >> 0x20);
        args_07.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_9e8;
        args_07.desc_ = 0xd;
        fmt_09.size_ = 0x1c;
        fmt_09.data_ = "Saved tileset image to \"{}\"\n";
        ::fmt::v10::vprint(fmt_09,args_07);
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&poStack_840);
      if (local_858 != (_Base_ptr)0x0) {
        operator_delete(local_858,(long)local_848 - (long)local_858);
      }
      if ((pointer)local_878._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_878._8_8_,(long)local_860 - local_878._8_8_);
      }
      pvVar5 = (void *)CONCAT44(local_898._20_4_,local_898._16_4_);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,local_878._0_8_ - (long)pvVar5);
      }
    }
    std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::~vector(&local_a08);
    iVar11 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != &local_928.field_2) {
    operator_delete(local_928._M_dataplus._M_p,
                    CONCAT71(local_928.field_2._M_allocated_capacity._1_7_,
                             local_928.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948._M_dataplus._M_p != &local_948.field_2) {
    operator_delete(local_948._M_dataplus._M_p,
                    CONCAT71(local_948.field_2._M_allocated_capacity._1_7_,
                             local_948.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968._M_dataplus._M_p != &local_968.field_2) {
    operator_delete(local_968._M_dataplus._M_p,
                    CONCAT71(local_968.field_2._M_allocated_capacity._1_7_,
                             local_968.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988._M_dataplus._M_p != &local_988.field_2) {
    operator_delete(local_988._M_dataplus._M_p,
                    CONCAT71(local_988.field_2._M_allocated_capacity._1_7_,
                             local_988.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
    operator_delete(local_9a8._M_dataplus._M_p,
                    CONCAT71(local_9a8.field_2._M_allocated_capacity._1_7_,
                             local_9a8.field_2._M_local_buf[0]) + 1);
  }
  return iVar11;
code_r0x00131626:
  poVar25 = poVar25 + 1;
  if (poVar25 == poVar8) goto LAB_00131b21;
  goto LAB_00131612;
code_r0x00131bad:
  poVar25 = poVar25 + 1;
  if (poVar25 == poVar8) goto LAB_00131c12;
  goto LAB_00131b9d;
code_r0x00131c96:
  poVar25 = poVar25 + 1;
  if (poVar25 == poVar8) goto LAB_00131cfb;
  goto LAB_00131c86;
code_r0x00131d7f:
  poVar25 = poVar25 + 1;
  if (poVar25 == poVar8) goto LAB_00131de4;
  goto LAB_00131d6f;
code_r0x00131e70:
  poVar25 = poVar25 + 1;
  if (poVar25 == poVar8) goto LAB_00131ed5;
  goto LAB_00131e60;
}

Assistant:

int sfc_tiles(int argc, char* argv[]) {
  SfcTiles::Settings settings = {};
  bool verbose = false;

  try {
    bool help = false;
    std::string mode_str;

    Options options;
    options.IndentDescription = sfc::Constants::options_indent;
    options.Header = "Usage: superfamiconv tiles [<options>]\n";

    // clang-format off
    options.Add(settings.in_image,           'i', "in-image",       "Input: image");
    options.Add(settings.in_data,            'n', "in-data",        "Input: native data");
    options.Add(settings.in_palette,         'p', "in-palette",     "Input: palette (native/json)");
    options.Add(settings.out_data,           'd', "out-data",       "Output: native data");
    options.Add(settings.out_image,          'o', "out-image",      "Output: image");

    options.Add(mode_str,                    'M', "mode",           "Mode <default: snes>",              std::string("snes"), "Settings");
    options.Add(settings.bpp,                'B', "bpp",            "Bits per pixel",                    unsigned(4),         "Settings");
    options.Add(settings.tile_w,             'W', "tile-width",     "Tile width",                        unsigned(8),         "Settings");
    options.Add(settings.tile_h,             'H', "tile-height",    "Tile height",                       unsigned(8),         "Settings");
    options.AddSwitch(settings.no_remap,     'R', "no-remap",       "Don't remap colors",                false,               "Settings");
    options.AddSwitch(settings.no_discard,   'D', "no-discard",     "Don't discard redundant tiles",     false,               "Settings");
    options.AddSwitch(settings.no_flip,      'F', "no-flip",        "Don't discard using tile flipping", false,               "Settings");
    options.AddSwitch(settings.sprite_mode,  'S', "sprite-mode",    "Apply sprite output settings",      false,               "Settings");
    options.Add(settings.max_tiles,          'T', "max-tiles",      "Maximum number of tiles",           unsigned(),          "Settings");
    options.Add(settings.out_image_width,   '\0', "out-image-width","Width of out-image",                unsigned(),          "Settings");

    options.AddSwitch(verbose,               'v', "verbose",        "Verbose logging", false, "_");
    options.AddSwitch(help,                  'h', "help",           "Show this help",  false, "_");
    // clang-format on

    if (!options.Parse(argc, argv))
      return 1;

    if (argc <= 2 || help) {
      std::cout << options.Usage();
      return 0;
    }

    settings.mode = sfc::mode(mode_str);

    // Set pce_sprite mode and sprite_mode interchangeably
    if (settings.sprite_mode && settings.mode == sfc::Mode::pce)
      settings.mode = sfc::Mode::pce_sprite;
    if (settings.mode == sfc::Mode::pce_sprite)
      settings.sprite_mode = true;

    // Mode-specific defaults
    if (!options.WasSet("bpp"))
      settings.bpp = sfc::default_bpp_for_mode(settings.mode);
    if (!options.WasSet("tile-width"))
      settings.tile_w = sfc::default_tile_size_for_mode(settings.mode);
    if (!options.WasSet("tile-height"))
      settings.tile_h = sfc::default_tile_size_for_mode(settings.mode);
    if (!options.WasSet("no-flip"))
      settings.no_flip = !sfc::tile_flipping_allowed_for_mode(settings.mode);
    if (!options.WasSet("max-tiles"))
      settings.max_tiles = sfc::max_tile_count_for_mode(settings.mode);

    if (!sfc::tile_width_allowed_for_mode(settings.tile_w, settings.mode)) {
      settings.tile_w = sfc::default_tile_size_for_mode(settings.mode);
      if (verbose)
        fmt::print("Tile width not allowed for specified mode, using default ({})\n", settings.tile_w);
    }

    if (!sfc::tile_height_allowed_for_mode(settings.tile_h, settings.mode)) {
      settings.tile_h = sfc::default_tile_size_for_mode(settings.mode);
      if (verbose)
        fmt::print("Tile height not allowed for specified mode, using default ({})\n", settings.tile_h);
    }

    // Sprite mode defaults
    if (settings.sprite_mode) {
      settings.no_discard = settings.no_flip = true;
    }

    if (!sfc::bpp_allowed_for_mode(settings.bpp, settings.mode))
      throw std::runtime_error("bpp setting not allowed for specified mode");

  } catch (const std::exception& e) {
    fmt::print(stderr, "Error: {}\n", e.what());
    return 1;
  }

  try {
    if (settings.in_image.empty() && settings.in_data.empty())
      throw std::runtime_error("Input image or native data required");

    if (verbose)
      fmt::print("Performing tiles operation in \"{}\" mode\n", sfc::mode(settings.mode));

    sfc::Tileset tileset;

    if (!settings.in_data.empty()) {
      // Native data input
      tileset = sfc::Tileset(sfc::read_binary(settings.in_data), settings.mode, settings.bpp, settings.tile_w, settings.tile_h,
                             settings.no_flip);
      if (verbose)
        fmt::print("Loaded tiles from \"{}\" ({} tiles)\n", settings.in_data, tileset.size());

    } else {
      // Image input
      sfc::Image image(settings.in_image);
      std::vector<sfc::Image> crops = image.crops(settings.tile_w, settings.tile_h, settings.mode);
      if (verbose)
        fmt::print("Loaded image from \"{}\" ({})\n", settings.in_image, image.description());

      if (settings.mode == sfc::Mode::pce && settings.sprite_mode) {
        if (image.width() % 16 || image.height() % 16)
          throw std::runtime_error("pce/sprite-mode requires image dimensions to be a multiple of 16");
      }

      if (verbose)
        fmt::print("Image sliced into {} {}x{}px tiles\n", crops.size(), settings.tile_w, settings.tile_h);

      sfc::Palette palette;
      tileset = sfc::Tileset(settings.mode, settings.bpp, settings.tile_w, settings.tile_h, settings.no_discard, settings.no_flip,
                             settings.no_remap, settings.max_tiles);

      if (settings.no_remap) {
        if (image.palette_size() == 0)
          throw std::runtime_error("\"--no-remap\" requires indexed color image");
        if (verbose)
          fmt::print("Creating tile data straight from color indices\n");

      } else {
        if (settings.in_palette.empty())
          throw std::runtime_error("Input palette required (except in --no-remap mode)");
        palette = sfc::Palette(settings.in_palette, settings.mode, sfc::palette_size_at_bpp(settings.bpp));
        if (palette.size() < 1)
          throw std::runtime_error("Input palette size is zero");
        if (verbose)
          fmt::print("Remapping tile data from palette \"{}\" ({})\n", settings.in_palette, palette.description());
      }

      for (auto& img : crops)
        tileset.add(img, &palette);
      if (tileset.is_full()) {
        throw std::runtime_error(
          fmt::format("Tileset exceeds maximum size ({} entries generated, {} maximum)", tileset.size(), tileset.max()));
      }
      if (verbose) {
        if (settings.no_discard) {
          fmt::print("Created tileset with {} entries\n", tileset.size());
        } else {
          fmt::print("Created optimized tileset with {} entries (discarded {} redundant tiles)\n", tileset.size(),
                     tileset.discarded_tiles);
        }
      }
    }

    // Write data
    if (!settings.out_data.empty()) {
      tileset.save(settings.out_data);
      if (verbose)
        fmt::print("Saved native tile data to \"{}\"\n", settings.out_data);
    }

    if (!settings.out_image.empty()) {
      sfc::Image tileset_image(tileset, settings.out_image_width);
      if (!settings.in_data.empty()) {
        tileset_image.save_indexed(settings.out_image);
      } else {
        tileset_image.save(settings.out_image);
      }
      if (verbose)
        fmt::print("Saved tileset image to \"{}\"\n", settings.out_image);
    }

  } catch (const std::exception& e) {
    fmt::print(stderr, "Error: {}\n", e.what());
    return 1;
  }

  return 0;
}